

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  StatsAccumulator *in_stack_ffffffffffffffe8;
  anon_class_1_0_00000001 *in_stack_fffffffffffffff0;
  
  operator()(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

TriangleMesh::TriangleMesh(const Transform &renderFromObject, bool reverseOrientation,
                           std::vector<int> indices, std::vector<Point3f> p,
                           std::vector<Vector3f> s, std::vector<Normal3f> n,
                           std::vector<Point2f> uv, std::vector<int> faceIndices,
                           Allocator alloc)
    : nTriangles(indices.size() / 3), nVertices(p.size()) {
    CHECK_EQ((indices.size() % 3), 0);
    ++nTriMeshes;
    nTris += nTriangles;
    triangleBytes += sizeof(*this);
    // Initialize mesh _vertexIndices_
    vertexIndices = intBufferCache->LookupOrAdd(indices, alloc);

    // Transform mesh vertices to rendering space and initialize mesh _p_
    for (Point3f &pt : p)
        pt = renderFromObject(pt);
    this->p = point3BufferCache->LookupOrAdd(p, alloc);

    // Remainder of _TriangleMesh_ constructor
    this->reverseOrientation = reverseOrientation;
    this->transformSwapsHandedness = renderFromObject.SwapsHandedness();

    if (!uv.empty()) {
        CHECK_EQ(nVertices, uv.size());
        this->uv = point2BufferCache->LookupOrAdd(uv, alloc);
    }
    if (!n.empty()) {
        CHECK_EQ(nVertices, n.size());
        for (Normal3f &nn : n) {
            nn = renderFromObject(nn);
            if (reverseOrientation)
                nn = -nn;
        }
        this->n = normal3BufferCache->LookupOrAdd(n, alloc);
    }
    if (!s.empty()) {
        CHECK_EQ(nVertices, s.size());
        for (Vector3f &ss : s)
            ss = renderFromObject(ss);
        this->s = vector3BufferCache->LookupOrAdd(s, alloc);
    }

    if (!faceIndices.empty()) {
        CHECK_EQ(nTriangles, faceIndices.size());
        this->faceIndices = intBufferCache->LookupOrAdd(faceIndices, alloc);
    }

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(p.size(), std::numeric_limits<int>::max());
    // We could be clever and check indices.size() / 3 if we were careful
    // to promote to a 64-bit int before multiplying by 3 when we look up
    // in the indices array...
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());
}